

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_framework.cpp
# Opt level: O3

void __thiscall PerformanceTestFramework::run(PerformanceTestFramework *this)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  double dVar3;
  double in_XMM1_Qa;
  double dVar4;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failedFunctionId;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48._M_impl._M_node._M_size = 0;
  p_Var2 = (this->_performanceTest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48._M_impl._M_node.super__List_node_base._M_prev =
       local_48._M_impl._M_node.super__List_node_base._M_next;
  while ((_Rb_tree_header *)p_Var2 != &(this->_performanceTest)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/",1);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"] ",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(char *)p_Var2[1]._M_parent,(long)p_Var2[1]._M_left);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"... ",4);
    std::ostream::flush();
    dVar3 = (double)(**(code **)(p_Var2 + 1))();
    *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 4;
    dVar4 = in_XMM1_Qa;
    poVar1 = std::ostream::_M_insert<double>(dVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"+/-",3);
    poVar1 = std::ostream::_M_insert<double>(in_XMM1_Qa * 3.0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    in_XMM1_Qa = dVar4;
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_48);
  return;
}

Assistant:

void PerformanceTestFramework::run() const
{
    std::list < std::string > failedFunctionId;
    size_t testId = 1;

    for( std::map < testFunction, std::string >::const_iterator test = _performanceTest.begin();
         test != _performanceTest.end(); ++test, ++testId ) {
        std::cout << "["<< testId << "/" << _performanceTest.size() << "] " << test->second << "... " << std::flush;

        try {
            std::pair < double, double > result = (test->first)();

            // We must display 3 sigma value because almost all values would be in this range
            std::cout << std::setprecision( 4 ) << result.first << "+/-" << 3 * result.second << " ms" << std::endl;
        }
        catch( imageException & ex ) {
            failedFunctionId.push_back( test->second );
            std::cout << "ERROR : library exception '" << ex.what() << "' raised" << std::endl;
        }
        catch( std::exception & ex ) {
            failedFunctionId.push_back( test->second );
            std::cout << "ERROR : exception '" << ex.what() << "' raised" << std::endl;
        }
        catch( ... ) {
            failedFunctionId.push_back( test->second );
            std::cout << "ERROR : unknown exception raised" << std::endl;
        }
    }
}